

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point.hpp
# Opt level: O0

Point * __thiscall astar::Point::operator+=(Point *this,Point *p)

{
  LogStream *pLVar1;
  LogStream local_48;
  Point *local_20;
  Point *p_local;
  Point *this_local;
  
  if (((((p->x < 1) || (this->x <= 0x7fffffff - p->x)) &&
       ((p->y < 1 || (this->y <= 0x7fffffff - p->y)))) &&
      ((-1 < p->x || (-0x80000000 - p->x <= this->x)))) &&
     ((-1 < p->y || (-0x80000000 - p->y <= this->y)))) {
    this->x = p->x + this->x;
    this->y = p->y + this->y;
  }
  else {
    local_48._16_8_ = 0;
    local_48._24_8_ = 0;
    local_48.data = (string)0x0;
    local_48._1_7_ = 0;
    local_48._8_8_ = 0;
    local_20 = p;
    p_local = this;
    details::LogStream::LogStream(&local_48);
    pLVar1 = details::LogStream::operator<<(&local_48,"[E: ");
    pLVar1 = details::LogStream::operator<<(pLVar1,"16:51:43");
    pLVar1 = details::LogStream::operator<<(pLVar1," ");
    pLVar1 = details::LogStream::operator<<
                       (pLVar1,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/AZMDDY[P]astar/include/point.hpp"
                       );
    pLVar1 = details::LogStream::operator<<(pLVar1,":");
    pLVar1 = details::LogStream::operator<<(pLVar1,0x1e);
    pLVar1 = details::LogStream::operator<<(pLVar1,"] ");
    details::LogStream::operator<<(pLVar1,"add point is out of range.");
    details::LogStream::~LogStream(&local_48);
  }
  return this;
}

Assistant:

Point& Point::operator+=(const Point& p)
{
    if ((p.x > 0 && INT32_MAX - p.x < x) || (p.y > 0 && INT32_MAX - p.y < y) || (p.x < 0 && INT32_MIN - p.x > x) ||
        (p.y < 0 && INT32_MIN - p.y > y)) {
        ALOG() << "add point is out of range.";
        return *this;
    }
    x += p.x;
    y += p.y;
    return *this;
}